

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

void anon_unknown.dwarf_153727::Report(ParseContext *ctx,Lexeme *pos,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *pos_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_d8;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &args[0].overflow_arg_area;
  local_d8.gp_offset = 0x18;
  local_d8.fp_offset = 0x30;
  if ((ctx->lastLexeme == pos) && (ctx->firstLexeme != pos)) {
    pos_00 = pos[-1].pos + pos[-1].length;
    pos = pos + -1;
  }
  else {
    pos_00 = pos->pos;
  }
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  ReportAt(ctx,pos,pos,pos_00,msg,&local_d8);
  return;
}

Assistant:

void Report(ParseContext &ctx, Lexeme *pos, const char *msg, ...)
	{
		va_list args;
		va_start(args, msg);

		if(pos == ctx.Last() && pos != ctx.First())
			ReportAt(ctx, pos - 1, pos - 1, (pos - 1)->pos + (pos - 1)->length, msg, args);
		else
			ReportAt(ctx, pos, pos, pos->pos, msg, args);

		va_end(args);
	}